

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

void __thiscall ast::Div::Div(Div *this,Token *t,int line)

{
  Token local_50;
  int local_1c;
  Token *pTStack_18;
  int line_local;
  Token *t_local;
  Div *this_local;
  
  local_1c = line;
  pTStack_18 = t;
  t_local = (Token *)this;
  token::Token::Token(&local_50,t);
  BinaryOp::BinaryOp(&this->super_BinaryOp,&local_50,3,0,local_1c);
  token::Token::~Token(&local_50);
  (this->super_BinaryOp).super_Op.super_Expr.super_Node._vptr_Node =
       (_func_int **)&PTR__Div_001e1078;
  return;
}

Assistant:

Div(Token t, int line)
        :BinaryOp(t, PRECENDENCE::DIV, ASSOCIATION::LEFT, line){}